

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O2

void palette_rd_y(AV1_COMP *cpi,MACROBLOCK *x,MB_MODE_INFO *mbmi,BLOCK_SIZE bsize,int dc_mode_cost,
                 int16_t *data,int16_t *centroids,int n,uint16_t *color_cache,int n_cache,
                 _Bool do_header_rd_based_gating,MB_MODE_INFO *best_mbmi,
                 uint8_t *best_palette_color_map,int64_t *best_rd,int *rate,int *rate_tokenonly,
                 int64_t *distortion,uint8_t *skippable,int *beat_best_rd,PICK_MODE_CONTEXT *ctx,
                 uint8_t *blk_skip,uint8_t *tx_type_map,int *beat_best_palette_rd,
                 _Bool *do_header_rd_based_breakout,int discount_color_cost)

{
  _Bool _Var1;
  _Bool _Var2;
  aom_bit_depth_t bd;
  SequenceHeader *pSVar3;
  uint8_t *color_map;
  MB_MODE_INFO *pMVar4;
  WinnerModeStats *pWVar5;
  AV1_COMP *cpi_00;
  uint16_t uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int64_t *piVar13;
  long lVar14;
  int i;
  ulong uVar15;
  byte bVar16;
  byte *pbVar17;
  uint uVar18;
  int cols;
  int block_height;
  int block_width;
  AV1_COMP *local_78;
  int block_width_1;
  MACROBLOCKD *xd;
  int rows;
  int local_5c;
  RD_STATS tokenonly_rd_stats;
  
  if (do_header_rd_based_breakout != (_Bool *)0x0) {
    *do_header_rd_based_breakout = false;
  }
  uVar18 = 1;
  optimize_palette_colors(color_cache,n_cache,n,1,centroids,((cpi->common).seq_params)->bit_depth);
  qsort(centroids,(long)n,2,int16_comparer);
  for (lVar11 = 1; lVar11 < n; lVar11 = lVar11 + 1) {
    if (centroids[lVar11] != centroids[lVar11 + -1]) {
      lVar14 = (long)(int)uVar18;
      uVar18 = uVar18 + 1;
      centroids[lVar14] = centroids[lVar11];
    }
  }
  if ((int)uVar18 < 2) {
    return;
  }
  pSVar3 = (cpi->common).seq_params;
  local_78 = cpi;
  if (pSVar3->use_highbitdepth == '\0') {
    for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
      uVar6 = centroids[uVar15];
      if (centroids[uVar15] < 1) {
        uVar6 = 0;
      }
      if (0xfe < (short)uVar6) {
        uVar6 = 0xff;
      }
      (mbmi->palette_mode_info).palette_colors[uVar15] = uVar6;
    }
  }
  else {
    bd = pSVar3->bit_depth;
    for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
      uVar6 = clip_pixel_highbd((int)centroids[uVar15],bd);
      (mbmi->palette_mode_info).palette_colors[uVar15] = uVar6;
    }
  }
  (mbmi->palette_mode_info).palette_size[0] = (uint8_t)uVar18;
  xd = &x->e_mbd;
  color_map = (x->e_mbd).plane[0].color_index_map;
  av1_get_block_dimensions(bsize,0,xd,&block_width,&block_height,&rows,&cols);
  (*av1_calc_indices_dim1)(data,centroids,color_map,(int64_t *)0x0,cols * rows,uVar18);
  extend_palette_color_map(color_map,cols,rows,block_width,block_height);
  cpi_00 = local_78;
  if (do_header_rd_based_gating) {
    iVar7 = intra_mode_info_cost_y(local_78,x,mbmi,bsize,dc_mode_cost,discount_color_cost);
    if (*best_rd <
        ((long)x->rdmult * (long)iVar7 + 0x100 >> 9) >>
        ((cpi_00->sf).intra_sf.prune_luma_palette_size_search_level == 1)) {
      *do_header_rd_based_breakout = true;
      return;
    }
    av1_pick_uniform_tx_size_type_yrd(cpi_00,x,&tokenonly_rd_stats,bsize,*best_rd);
    iVar8 = tokenonly_rd_stats.rate;
    if (tokenonly_rd_stats.rate == 0x7fffffff) {
      return;
    }
  }
  else {
    av1_pick_uniform_tx_size_type_yrd(local_78,x,&tokenonly_rd_stats,bsize,*best_rd);
    iVar7 = tokenonly_rd_stats.rate;
    if (tokenonly_rd_stats.rate == 0x7fffffff) {
      return;
    }
    iVar8 = intra_mode_info_cost_y(cpi_00,x,mbmi,bsize,dc_mode_cost,discount_color_cost);
  }
  lVar11 = tokenonly_rd_stats.dist * 0x80 + ((long)x->rdmult * (long)(iVar8 + iVar7) + 0x100 >> 9);
  if (((x->e_mbd).lossless[*(ushort *)&mbmi->field_0xa7 & 7] == 0) && (mbmi->bsize != BLOCK_4X4)) {
    iVar9 = 0;
    if ((bsize != BLOCK_4X4) && (iVar9 = 0, (x->txfm_search_params).tx_mode_search_type == '\x02'))
    {
      lVar14 = (long)(x->mode_costs).skip_txfm_cost +
               (ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table[bsize] * 0x3c + -0x24;
      for (pbVar17 = "" + bsize; *pbVar17 != mbmi->tx_size; pbVar17 = "" + *pbVar17) {
        lVar14 = lVar14 + 4;
      }
      _Var1 = (x->e_mbd).up_available;
      _Var2 = (x->e_mbd).left_available;
      bVar16 = *(x->e_mbd).above_txfm_context;
      if ((_Var1 == true) &&
         ((pMVar4 = (x->e_mbd).above_mbmi, (pMVar4->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar4->ref_frame[0])))) {
        bVar16 = block_size_wide[pMVar4->bsize];
      }
      uVar18 = (uint)CONCAT71(0x43f5,*(x->e_mbd).left_txfm_context);
      if ((_Var2 != false) &&
         ((pMVar4 = (x->e_mbd).left_mbmi, (pMVar4->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar4->ref_frame[0])))) {
        uVar18 = (uint)block_size_high[pMVar4->bsize];
      }
      iVar9 = *(int *)(lVar14 + ((ulong)(byte)(_Var1 & tx_size_wide[""[(*(x->e_mbd).mi)->bsize]] <=
                                                       (int)(uint)bVar16) +
                                (ulong)(byte)(_Var2 & tx_size_high[""[(*(x->e_mbd).mi)->bsize]] <=
                                                      (int)(uVar18 & 0xff))) * 0x14);
    }
    tokenonly_rd_stats.rate = tokenonly_rd_stats.rate - iVar9;
  }
  uVar15 = (ulong)(local_78->sf).winner_mode_sf.multi_winner_mode_type;
  if ((lVar11 != 0x7fffffffffffffff && uVar15 != 0) &&
     ((pWVar5 = x->winner_mode_stats, ((local_78->common).current_frame.frame_type & 0xfd) == 0 ||
      ((mbmi->palette_mode_info).palette_size[0] == '\0')))) {
    uVar18 = winner_mode_count_allowed[uVar15];
    uVar10 = x->winner_mode_count;
    if (uVar10 == 0) {
      uVar15 = 0;
    }
    else {
      uVar12 = 0;
      uVar15 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar15 = uVar12;
      }
      piVar13 = &pWVar5->rd;
      for (; uVar15 != uVar12; uVar12 = uVar12 + 1) {
        if (lVar11 < *piVar13) {
          uVar15 = uVar12 & 0xffffffff;
          break;
        }
        piVar13 = piVar13 + 0x81e;
      }
      uVar10 = (uint)uVar15;
      if (uVar10 == uVar18) goto LAB_001c9689;
      if ((int)uVar10 < (int)(uVar18 - 1)) {
        memmove(pWVar5 + uVar15 + 1,pWVar5 + uVar15,(long)(int)(~uVar10 + uVar18) * 0x40f0);
      }
    }
    memcpy(pWVar5 + uVar15,mbmi,0xb0);
    pWVar5[uVar15].rd = lVar11;
    pWVar5[uVar15].mode_index = 0x9c;
    if (color_map != (uint8_t *)0x0) {
      av1_get_block_dimensions(bsize,0,xd,&block_width_1,&local_5c,(int *)0x0,(int *)0x0);
      memcpy(pWVar5[uVar15].color_index_map,color_map,(long)local_5c * (long)block_width_1);
    }
    uVar10 = x->winner_mode_count + 1;
    if ((int)uVar18 <= (int)uVar10) {
      uVar10 = uVar18;
    }
    x->winner_mode_count = uVar10;
  }
LAB_001c9689:
  if (lVar11 < *best_rd) {
    *best_rd = lVar11;
    if (beat_best_rd != (int *)0x0) {
      *beat_best_rd = 1;
    }
    memcpy(best_palette_color_map,color_map,(long)block_height * (long)block_width);
    memcpy(best_mbmi,mbmi,0xb0);
    memcpy(blk_skip,(x->txfm_search_info).blk_skip,(long)ctx->num_4x4_blk);
    memcpy(tx_type_map,(x->e_mbd).tx_type_map,(long)ctx->num_4x4_blk);
    if (rate != (int *)0x0) {
      *rate = iVar8 + iVar7;
    }
    if (rate_tokenonly != (int *)0x0) {
      *rate_tokenonly = tokenonly_rd_stats.rate;
    }
    if (distortion != (int64_t *)0x0) {
      *distortion = tokenonly_rd_stats.dist;
    }
    if (skippable != (uint8_t *)0x0) {
      *skippable = tokenonly_rd_stats.skip_txfm;
    }
    if (beat_best_palette_rd != (int *)0x0) {
      *beat_best_palette_rd = 1;
    }
  }
  return;
}

Assistant:

static inline void palette_rd_y(
    const AV1_COMP *const cpi, MACROBLOCK *x, MB_MODE_INFO *mbmi,
    BLOCK_SIZE bsize, int dc_mode_cost, const int16_t *data, int16_t *centroids,
    int n, uint16_t *color_cache, int n_cache, bool do_header_rd_based_gating,
    MB_MODE_INFO *best_mbmi, uint8_t *best_palette_color_map, int64_t *best_rd,
    int *rate, int *rate_tokenonly, int64_t *distortion, uint8_t *skippable,
    int *beat_best_rd, PICK_MODE_CONTEXT *ctx, uint8_t *blk_skip,
    uint8_t *tx_type_map, int *beat_best_palette_rd,
    bool *do_header_rd_based_breakout, int discount_color_cost) {
  if (do_header_rd_based_breakout != NULL) *do_header_rd_based_breakout = false;
  optimize_palette_colors(color_cache, n_cache, n, 1, centroids,
                          cpi->common.seq_params->bit_depth);
  const int num_unique_colors = remove_duplicates(centroids, n);
  if (num_unique_colors < PALETTE_MIN_SIZE) {
    // Too few unique colors to create a palette. And DC_PRED will work
    // well for that case anyway. So skip.
    return;
  }
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  if (cpi->common.seq_params->use_highbitdepth) {
    for (int i = 0; i < num_unique_colors; ++i) {
      pmi->palette_colors[i] = clip_pixel_highbd(
          (int)centroids[i], cpi->common.seq_params->bit_depth);
    }
  } else {
    for (int i = 0; i < num_unique_colors; ++i) {
      pmi->palette_colors[i] = clip_pixel(centroids[i]);
    }
  }
  pmi->palette_size[0] = num_unique_colors;
  MACROBLOCKD *const xd = &x->e_mbd;
  uint8_t *const color_map = xd->plane[0].color_index_map;
  int block_width, block_height, rows, cols;
  av1_get_block_dimensions(bsize, 0, xd, &block_width, &block_height, &rows,
                           &cols);
  av1_calc_indices(data, centroids, color_map, rows * cols, num_unique_colors,
                   1);
  extend_palette_color_map(color_map, cols, rows, block_width, block_height);

  RD_STATS tokenonly_rd_stats;
  int this_rate;

  if (do_header_rd_based_gating) {
    assert(do_header_rd_based_breakout != NULL);
    const int palette_mode_rate = intra_mode_info_cost_y(
        cpi, x, mbmi, bsize, dc_mode_cost, discount_color_cost);
    const int64_t header_rd = RDCOST(x->rdmult, palette_mode_rate, 0);
    // Less aggressive pruning when prune_luma_palette_size_search_level == 1.
    const int header_rd_shift =
        (cpi->sf.intra_sf.prune_luma_palette_size_search_level == 1) ? 1 : 0;
    // Terminate further palette_size search, if the header cost corresponding
    // to lower palette_size is more than *best_rd << header_rd_shift. This
    // logic is implemented with a right shift in the LHS to prevent a possible
    // overflow with the left shift in RHS.
    if ((header_rd >> header_rd_shift) > *best_rd) {
      *do_header_rd_based_breakout = true;
      return;
    }
    av1_pick_uniform_tx_size_type_yrd(cpi, x, &tokenonly_rd_stats, bsize,
                                      *best_rd);
    if (tokenonly_rd_stats.rate == INT_MAX) return;
    this_rate = tokenonly_rd_stats.rate + palette_mode_rate;
  } else {
    av1_pick_uniform_tx_size_type_yrd(cpi, x, &tokenonly_rd_stats, bsize,
                                      *best_rd);
    if (tokenonly_rd_stats.rate == INT_MAX) return;
    this_rate = tokenonly_rd_stats.rate +
                intra_mode_info_cost_y(cpi, x, mbmi, bsize, dc_mode_cost,
                                       discount_color_cost);
  }

  int64_t this_rd = RDCOST(x->rdmult, this_rate, tokenonly_rd_stats.dist);
  if (!xd->lossless[mbmi->segment_id] && block_signals_txsize(mbmi->bsize)) {
    tokenonly_rd_stats.rate -= tx_size_cost(x, bsize, mbmi->tx_size);
  }
  // Collect mode stats for multiwinner mode processing
  const int txfm_search_done = 1;
  store_winner_mode_stats(
      &cpi->common, x, mbmi, NULL, NULL, NULL, THR_DC, color_map, bsize,
      this_rd, cpi->sf.winner_mode_sf.multi_winner_mode_type, txfm_search_done);
  if (this_rd < *best_rd) {
    *best_rd = this_rd;
    // Setting beat_best_rd flag because current mode rd is better than best_rd.
    // This flag need to be updated only for palette evaluation in key frames
    if (beat_best_rd) *beat_best_rd = 1;
    memcpy(best_palette_color_map, color_map,
           block_width * block_height * sizeof(color_map[0]));
    *best_mbmi = *mbmi;
    memcpy(blk_skip, x->txfm_search_info.blk_skip,
           sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
    av1_copy_array(tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
    if (rate) *rate = this_rate;
    if (rate_tokenonly) *rate_tokenonly = tokenonly_rd_stats.rate;
    if (distortion) *distortion = tokenonly_rd_stats.dist;
    if (skippable) *skippable = tokenonly_rd_stats.skip_txfm;
    if (beat_best_palette_rd) *beat_best_palette_rd = 1;
  }
}